

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O2

void __thiscall google::protobuf::StringValue::~StringValue(StringValue *this)

{
  ~StringValue(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

StringValue::~StringValue() {
  // @@protoc_insertion_point(destructor:google.protobuf.StringValue)
  SharedDtor(*this);
}